

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  char cVar2;
  CURLcode CVar3;
  undefined8 *puVar4;
  ulong uVar5;
  char *pcVar6;
  
  pCVar1 = conn->data;
  puVar4 = (undefined8 *)(*Curl_ccalloc)(0x20,1);
  (conn->data->req).protop = puVar4;
  if (puVar4 == (undefined8 *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar6 = (pCVar1->state).up.path + 1;
    *puVar4 = pcVar6;
    pcVar6 = strstr(pcVar6,";type=");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strstr((conn->host).rawalloc,";type=");
    }
    if (pcVar6 != (char *)0x0) {
      *pcVar6 = '\0';
      cVar2 = Curl_raw_toupper(pcVar6[6]);
      uVar5 = *(ulong *)&(pCVar1->set).field_0x978;
      if (cVar2 == 'D') {
        uVar5 = uVar5 | 0x2000;
      }
      else if (cVar2 == 'A') {
        uVar5 = uVar5 | 0x800;
      }
      else {
        uVar5 = uVar5 & 0xfffffffffffff7ff;
      }
      *(ulong *)&(pCVar1->set).field_0x978 = uVar5;
    }
    *(undefined4 *)(puVar4 + 2) = 0;
    puVar4[3] = 0;
    (conn->proto).ftpc.known_filesize = -1;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  char *type;
  struct FTP *ftp;

  conn->data->req.protop = ftp = calloc(sizeof(struct FTP), 1);
  if(NULL == ftp)
    return CURLE_OUT_OF_MEMORY;

  ftp->path = &data->state.up.path[1]; /* don't include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we'll try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->set.ftp_list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = FTPTRANSFER_BODY;
  ftp->downloadsize = 0;
  conn->proto.ftpc.known_filesize = -1; /* unknown size for now */

  return CURLE_OK;
}